

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineValidator.cpp
# Opt level: O3

Result * CoreML::validate(Result *__return_storage_ptr__,Model *spec,Pipeline *pipelineParams)

{
  TypeUnion TVar1;
  mapped_type pFVar2;
  Rep *pRVar3;
  FeatureDescription *pFVar4;
  long *plVar5;
  pointer pcVar6;
  Result *pRVar7;
  RepeatedPtrFieldBase *this;
  uint uVar8;
  bool bVar9;
  ModelDescription *pMVar10;
  mapped_type *ppFVar11;
  Result *extraout_RAX;
  Result *extraout_RAX_00;
  iterator iVar12;
  Type *pTVar13;
  Type *pTVar14;
  iterator iVar15;
  undefined8 *puVar16;
  Result *extraout_RAX_01;
  uint uVar17;
  ulong uVar18;
  ulong *puVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  ulong uVar23;
  void **ppvVar24;
  uint uVar25;
  undefined8 uVar26;
  _Alloc_hider _Var27;
  uint uVar28;
  long lVar29;
  Model *pMVar30;
  uint uVar31;
  Rep *pRVar32;
  long lVar33;
  string modelName;
  Model model;
  string __str;
  string __str_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
  typeTable;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  Result *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [32];
  TypeUnion local_110;
  size_t local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  Pipeline *local_c0;
  Model *local_b8;
  RepeatedPtrFieldBase *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  ModelDescription **local_a0;
  long local_98;
  ModelDescription *local_90 [2];
  Model *local_80;
  void **local_78;
  ulong local_70;
  undefined1 local_68 [32];
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  uVar18 = (ulong)(pipelineParams->models_).super_RepeatedPtrFieldBase.current_size_;
  local_c0 = pipelineParams;
  local_70 = uVar18;
  if (uVar18 == 0) {
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Pipeline must contain one or more models.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_68);
    if ((undefined1 *)local_68._0_8_ == local_68 + 0x10) {
      return extraout_RAX;
    }
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    return extraout_RAX_00;
  }
  local_68._0_8_ = &p_Stack_38;
  local_68._8_8_ = 1;
  local_68._16_8_ = 0;
  local_68._24_8_ = 0;
  local_48 = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  pMVar10 = spec->description_;
  if (pMVar10 == (ModelDescription *)0x0) {
    pMVar10 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  pRVar32 = (pMVar10->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar24 = pRVar32->elements;
  if (pRVar32 == (Rep *)0x0) {
    ppvVar24 = (void **)0x0;
  }
  lVar33 = (long)(pMVar10->input_).super_RepeatedPtrFieldBase.current_size_;
  local_158 = __return_storage_ptr__;
  if (lVar33 == 0) {
    local_b0 = &(pipelineParams->models_).super_RepeatedPtrFieldBase;
    pRVar32 = (pipelineParams->models_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar32 != (Rep *)0x0) {
      pRVar32 = (Rep *)pRVar32->elements;
    }
LAB_00312d27:
    local_78 = pRVar32->elements + (uVar18 - 1);
    local_a8 = &(local_158->m_message).field_2;
    local_80 = spec;
    do {
      local_b8 = *(Model **)pRVar32;
      pMVar10 = local_b8->description_;
      if (pMVar10 == (ModelDescription *)0x0) {
        pMVar10 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
      }
      pRVar3 = (pMVar10->input_).super_RepeatedPtrFieldBase.rep_;
      ppvVar24 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar24 = (void **)0x0;
      }
      lVar33 = (long)(pMVar10->input_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar33 != 0) {
        lVar29 = 0;
        do {
          pFVar4 = *(FeatureDescription **)((long)ppvVar24 + lVar29);
          iVar12 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_68,
                          (key_type *)((ulong)(pFVar4->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe)
                         );
          if (iVar12.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::operator+(&local_150,"Pipeline: the input \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)(pFVar4->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
            pRVar7 = local_158;
            paVar21 = &local_178.field_2;
            puVar19 = puVar16 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar16 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_178.field_2._M_allocated_capacity = *puVar19;
              local_178.field_2._8_8_ = puVar16[3];
              local_178._M_dataplus._M_p = (pointer)paVar21;
            }
            else {
              local_178.field_2._M_allocated_capacity = *puVar19;
              local_178._M_dataplus._M_p = (pointer)*puVar16;
            }
            local_178._M_string_length = puVar16[1];
            *puVar16 = puVar19;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            pMVar10 = local_b8->description_;
            if (pMVar10 == (ModelDescription *)0x0) {
              pMVar10 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
            }
            Specification::ModelDescription::GetTypeName_abi_cxx11_(&local_100,pMVar10);
            uVar26 = (ModelDescription *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != paVar21) {
              uVar26 = local_178.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 <
                (ModelDescription *)(local_100._M_string_length + local_178._M_string_length)) {
              uVar26 = (ModelDescription *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                uVar26 = local_100.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar26 <
                  (ModelDescription *)(local_100._M_string_length + local_178._M_string_length))
              goto LAB_003130ff;
              puVar16 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_100,0,(char *)0x0,(ulong)local_178._M_dataplus._M_p
                                  );
            }
            else {
LAB_003130ff:
              puVar16 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_178,(ulong)local_100._M_dataplus._M_p);
            }
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar16 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar16 == paVar20) {
              local_198.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_198.field_2._8_8_ = puVar16[3];
            }
            else {
              local_198.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_198._M_dataplus._M_p = (pointer)*puVar16;
            }
            local_198._M_string_length = puVar16[1];
            *puVar16 = paVar20;
            puVar16[1] = 0;
            paVar20->_M_local_buf[0] = '\0';
            puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar16 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar16 == paVar20) {
              local_130._16_8_ = paVar20->_M_allocated_capacity;
              local_130._24_8_ = *(TypeUnion *)(puVar16 + 3);
              local_130._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_130 + 0x10);
            }
            else {
              local_130._16_8_ = paVar20->_M_allocated_capacity;
              local_130._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar16;
            }
            local_130._8_8_ = puVar16[1];
            *puVar16 = paVar20;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            Result::Result(pRVar7,INVALID_MODEL_PARAMETERS,(string *)local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_130 + 0x10)) {
              operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,
                              (ulong)(local_100.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != paVar21) {
              operator_delete(local_178._M_dataplus._M_p,
                              (ulong)(local_178.field_2._M_allocated_capacity + 1));
            }
            uVar26 = local_150.field_2._M_allocated_capacity;
            _Var27._M_p = local_150._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p == &local_150.field_2) goto LAB_00313abd;
            goto LAB_00313ab5;
          }
          bVar9 = Specification::isEquivalent
                            (pFVar4,*(FeatureDescription **)
                                     ((long)iVar12.
                                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
                                            ._M_cur + 0x28));
          if (!bVar9) {
            std::operator+(&local_100,"Pipeline: the input \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)(pFVar4->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
            pRVar7 = local_158;
            paVar21 = &local_150.field_2;
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar16 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar16 == paVar20) {
              local_150.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_150.field_2._8_8_ = puVar16[3];
              local_150._M_dataplus._M_p = (pointer)paVar21;
            }
            else {
              local_150.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_150._M_dataplus._M_p = (pointer)*puVar16;
            }
            local_150._M_string_length = puVar16[1];
            *puVar16 = paVar20;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            pMVar10 = local_b8->description_;
            if (pMVar10 == (ModelDescription *)0x0) {
              pMVar10 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
            }
            Specification::ModelDescription::GetTypeName_abi_cxx11_(&local_e0,pMVar10);
            uVar26 = (ModelDescription *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != paVar21) {
              uVar26 = local_150.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 <
                (ModelDescription *)(local_e0._M_string_length + local_150._M_string_length)) {
              uVar26 = (ModelDescription *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                uVar26 = local_e0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar26 <
                  (ModelDescription *)(local_e0._M_string_length + local_150._M_string_length))
              goto LAB_0031319e;
              puVar16 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_e0,0,(char *)0x0,(ulong)local_150._M_dataplus._M_p)
              ;
            }
            else {
LAB_0031319e:
              puVar16 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_150,(ulong)local_e0._M_dataplus._M_p);
            }
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            puVar19 = puVar16 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar16 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_178.field_2._M_allocated_capacity = *puVar19;
              local_178.field_2._8_8_ = puVar16[3];
            }
            else {
              local_178.field_2._M_allocated_capacity = *puVar19;
              local_178._M_dataplus._M_p = (pointer)*puVar16;
            }
            local_178._M_string_length = puVar16[1];
            *puVar16 = puVar19;
            puVar16[1] = 0;
            *(undefined1 *)puVar19 = 0;
            puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar16 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar16 == paVar20) {
              local_198.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_198.field_2._8_8_ = puVar16[3];
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            }
            else {
              local_198.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
              local_198._M_dataplus._M_p = (pointer)*puVar16;
            }
            local_198._M_string_length = puVar16[1];
            *puVar16 = paVar20;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar16 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar16 == paVar20) {
              local_130._16_8_ = paVar20->_M_allocated_capacity;
              local_130._24_8_ = *(TypeUnion *)(puVar16 + 3);
              local_130._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_130 + 0x10);
            }
            else {
              local_130._16_8_ = paVar20->_M_allocated_capacity;
              local_130._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar16;
            }
            local_130._8_8_ = puVar16[1];
            *puVar16 = paVar20;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            Result::Result(pRVar7,TYPE_MISMATCH,(string *)local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_130 + 0x10)) {
              operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,
                              (ulong)(local_178.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,
                              (ulong)(local_e0.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != paVar21) {
              operator_delete(local_150._M_dataplus._M_p,
                              (ulong)(local_150.field_2._M_allocated_capacity + 1));
            }
            uVar26 = local_100.field_2._M_allocated_capacity;
            _Var27._M_p = local_100._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) goto LAB_00313ab5;
            goto LAB_00313abd;
          }
          lVar29 = lVar29 + 8;
        } while (lVar33 * 8 != lVar29);
      }
      pMVar30 = local_b8;
      pRVar7 = local_158;
      Model::validate(local_158,local_b8);
      bVar9 = Result::good(pRVar7);
      if (!bVar9) goto LAB_00313abd;
      pMVar10 = pMVar30->description_;
      if (pMVar10 == (ModelDescription *)0x0) {
        pMVar10 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
      }
      pRVar3 = (pMVar10->output_).super_RepeatedPtrFieldBase.rep_;
      ppvVar24 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar24 = (void **)0x0;
      }
      lVar33 = (long)(pMVar10->output_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar33 != 0) {
        lVar29 = 0;
        do {
          pFVar2 = *(mapped_type *)((long)ppvVar24 + lVar29);
          ppFVar11 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)local_68,
                                  (key_type *)
                                  ((ulong)(pFVar2->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          *ppFVar11 = pFVar2;
          lVar29 = lVar29 + 8;
        } while (lVar33 * 8 != lVar29);
      }
      plVar5 = (long *)(local_158->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar5 != local_a8) {
        operator_delete(plVar5,local_a8->_M_allocated_capacity + 1);
      }
      pRVar32 = (Rep *)pRVar32->elements;
      spec = local_80;
    } while (pRVar32 != (Rep *)local_78);
  }
  else {
    lVar29 = 0;
    do {
      pFVar2 = *(mapped_type *)((long)ppvVar24 + lVar29);
      ppFVar11 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_68,
                              (key_type *)
                              ((ulong)(pFVar2->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      *ppFVar11 = pFVar2;
      lVar29 = lVar29 + 8;
    } while (lVar33 * 8 != lVar29);
    uVar18 = (ulong)(local_c0->models_).super_RepeatedPtrFieldBase.current_size_;
    local_b0 = &(local_c0->models_).super_RepeatedPtrFieldBase;
    pRVar32 = (local_c0->models_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar32 != (Rep *)0x0) {
      pRVar32 = (Rep *)pRVar32->elements;
    }
    if (uVar18 != 0) goto LAB_00312d27;
  }
  pMVar10 = spec->description_;
  if (pMVar10 == (ModelDescription *)0x0) {
    pMVar10 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  pRVar32 = (pMVar10->output_).super_RepeatedPtrFieldBase.rep_;
  ppvVar24 = pRVar32->elements;
  if (pRVar32 == (Rep *)0x0) {
    ppvVar24 = (void **)0x0;
  }
  lVar33 = (long)(pMVar10->output_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar33 != 0) {
    lVar29 = 0;
    do {
      pFVar4 = *(FeatureDescription **)((long)ppvVar24 + lVar29);
      iVar12 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_68,
                      (key_type *)((ulong)(pFVar4->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      if (iVar12.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::operator+(&local_198,"Pipeline output \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(pFVar4->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
        local_130._0_8_ = local_130 + 0x10;
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar21) {
          local_130._16_8_ = paVar21->_M_allocated_capacity;
          local_130._24_8_ = *(TypeUnion *)(puVar16 + 3);
        }
        else {
          local_130._16_8_ = paVar21->_M_allocated_capacity;
          local_130._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar16;
        }
        local_130._8_8_ = puVar16[1];
        *puVar16 = paVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        Result::Result(local_158,INVALID_MODEL_PARAMETERS,(string *)local_130);
LAB_00313a8b:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_130 + 0x10)) {
          operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
        }
        uVar26 = local_198.field_2._M_allocated_capacity;
        _Var27._M_p = local_198._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p == &local_198.field_2) goto LAB_00313abd;
        goto LAB_00313ab5;
      }
      bVar9 = Specification::isEquivalent
                        (pFVar4,*(FeatureDescription **)
                                 ((long)iVar12.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
                                        ._M_cur + 0x28));
      if (!bVar9) {
        std::operator+(&local_198,"Type of pipeline output \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(pFVar4->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        pRVar7 = local_158;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
        local_130._0_8_ = local_130 + 0x10;
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar21) {
          local_130._16_8_ = paVar21->_M_allocated_capacity;
          local_130._24_8_ = *(TypeUnion *)(puVar16 + 3);
        }
        else {
          local_130._16_8_ = paVar21->_M_allocated_capacity;
          local_130._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar16;
        }
        local_130._8_8_ = puVar16[1];
        *puVar16 = paVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        Result::Result(pRVar7,TYPE_MISMATCH,(string *)local_130);
        goto LAB_00313a8b;
      }
      lVar29 = lVar29 + 8;
    } while (lVar33 * 8 != lVar29);
  }
  uVar18 = local_70;
  this = local_b0;
  uVar28 = (uint)local_70;
  pMVar30 = (Model *)(local_70 & 0xffffffff);
  if (spec->isupdatable_ == false) {
    if (0 < (int)uVar28) {
      uVar25 = 0;
      do {
        pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                            (this,uVar25);
        Specification::Model::Model((Model *)local_130,pTVar13);
        if ((bool)local_130[0x1c] == true) {
          uVar28 = 1;
          if (uVar25 < 10) goto LAB_00313e95;
          uVar18 = (ulong)uVar25;
          uVar31 = 4;
          goto LAB_003139ec;
        }
        Specification::Model::~Model((Model *)local_130);
        uVar25 = uVar25 + 1;
      } while (uVar28 != uVar25);
    }
LAB_003134eb:
    uVar25 = (local_c0->names_).super_RepeatedPtrFieldBase.current_size_;
    if (0 < (int)uVar25) {
      if (uVar25 != uVar28) {
        uVar31 = 1;
        if (9 < uVar25) {
          uVar17 = uVar25;
          uVar8 = 4;
          do {
            uVar31 = uVar8;
            if (uVar17 < 100) {
              uVar31 = uVar31 - 2;
              goto LAB_00313b52;
            }
            if (uVar17 < 1000) {
              uVar31 = uVar31 - 1;
              goto LAB_00313b52;
            }
            if (uVar17 < 10000) goto LAB_00313b52;
            bVar9 = 99999 < uVar17;
            uVar17 = uVar17 / 10000;
            uVar8 = uVar31 + 4;
          } while (bVar9);
          uVar31 = uVar31 + 1;
        }
LAB_00313b52:
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar31);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_100._M_dataplus._M_p,uVar31,uVar25);
        puVar16 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x3bb63c);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar21) {
          local_150.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_150.field_2._8_8_ = puVar16[3];
        }
        else {
          local_150.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_150._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_150._M_string_length = puVar16[1];
        *puVar16 = paVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
        paVar21 = &local_178.field_2;
        puVar19 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar19) {
          local_178.field_2._M_allocated_capacity = *puVar19;
          local_178.field_2._8_8_ = puVar16[3];
          local_178._M_dataplus._M_p = (pointer)paVar21;
        }
        else {
          local_178.field_2._M_allocated_capacity = *puVar19;
          local_178._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_178._M_string_length = puVar16[1];
        *puVar16 = puVar19;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        uVar25 = -uVar28;
        if (0 < (int)uVar28) {
          uVar25 = uVar28;
        }
        uVar28 = 1;
        if (9 < uVar25) {
          uVar23 = (ulong)uVar25;
          uVar31 = 4;
          do {
            uVar28 = uVar31;
            uVar17 = (uint)uVar23;
            if (uVar17 < 100) {
              uVar28 = uVar28 - 2;
              goto LAB_00313c9f;
            }
            if (uVar17 < 1000) {
              uVar28 = uVar28 - 1;
              goto LAB_00313c9f;
            }
            if (uVar17 < 10000) goto LAB_00313c9f;
            uVar23 = uVar23 / 10000;
            uVar31 = uVar28 + 4;
          } while (99999 < uVar17);
          uVar28 = uVar28 + 1;
        }
LAB_00313c9f:
        uVar18 = uVar18 >> 0x1f & 1;
        paVar20 = &local_e0.field_2;
        local_e0._M_dataplus._M_p = (pointer)paVar20;
        std::__cxx11::string::_M_construct((ulong)&local_e0,(char)uVar28 + (char)uVar18);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_e0._M_dataplus._M_p + uVar18,uVar28,uVar25);
        pRVar7 = local_158;
        uVar26 = (ModelDescription *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != paVar21) {
          uVar26 = local_178.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar26 <
            (ModelDescription *)(local_e0._M_string_length + local_178._M_string_length)) {
          uVar26 = (ModelDescription *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar20) {
            uVar26 = local_e0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar26 <
              (ModelDescription *)(local_e0._M_string_length + local_178._M_string_length))
          goto LAB_00313d2b;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_e0,0,(char *)0x0,(ulong)local_178._M_dataplus._M_p);
        }
        else {
LAB_00313d2b:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_178,(ulong)local_e0._M_dataplus._M_p);
        }
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar22) {
          local_198.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
          local_198.field_2._8_8_ = puVar16[3];
        }
        else {
          local_198.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
          local_198._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_198._M_string_length = puVar16[1];
        *puVar16 = paVar22;
        puVar16[1] = 0;
        paVar22->_M_local_buf[0] = '\0';
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
        paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar22) {
          local_130._16_8_ = paVar22->_M_allocated_capacity;
          local_130._24_8_ = *(TypeUnion *)(puVar16 + 3);
          local_130._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_130 + 0x10);
        }
        else {
          local_130._16_8_ = paVar22->_M_allocated_capacity;
          local_130._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar16;
        }
        local_130._8_8_ = puVar16[1];
        *puVar16 = paVar22;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        Result::Result(pRVar7,INVALID_MODEL_PARAMETERS,(string *)local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_130 + 0x10)) {
          operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar20) {
          operator_delete(local_e0._M_dataplus._M_p,
                          (ulong)(local_e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != paVar21) {
          operator_delete(local_178._M_dataplus._M_p,
                          (ulong)(local_178.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,
                          (ulong)(local_150.field_2._M_allocated_capacity + 1));
        }
        uVar26 = local_100.field_2._M_allocated_capacity;
        _Var27._M_p = local_100._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p == &local_100.field_2) goto LAB_00313abd;
        goto LAB_00313ab5;
      }
      TVar1.pipelineclassifier_ = (PipelineClassifier *)(local_130 + 8);
      local_130._8_8_ = local_130._8_8_ & 0xffffffff00000000;
      uVar28 = 0;
      local_130._16_8_ = (ModelDescription *)0x0;
      local_108 = 0;
      local_c0 = (Pipeline *)&local_c0->names_;
      local_130._24_8_ = TVar1.pipelineclassifier_;
      local_110.pipelineclassifier_ = TVar1.pipelineclassifier_;
      local_b8 = pMVar30;
      do {
        pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            ((RepeatedPtrFieldBase *)local_c0,uVar28);
        pcVar6 = (pTVar14->_M_dataplus)._M_p;
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,pcVar6,pcVar6 + pTVar14->_M_string_length);
        iVar15 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_130,&local_198);
        if (iVar15._M_node == (_Base_ptr)TVar1.pipelineclassifier_) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_130,&local_198);
        }
        else {
          std::operator+(&local_e0,"Pipeline model name \'",&local_198);
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar16 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar16 == paVar21) {
            local_100.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
            local_100.field_2._8_8_ = puVar16[3];
          }
          else {
            local_100.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
            local_100._M_dataplus._M_p = (pointer)*puVar16;
          }
          local_100._M_string_length = puVar16[1];
          *puVar16 = paVar21;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          uVar25 = 1;
          if (9 < uVar28) {
            uVar31 = 4;
            uVar17 = uVar28;
            do {
              uVar25 = uVar31;
              if (uVar17 < 100) {
                uVar25 = uVar25 - 2;
                goto LAB_0031365e;
              }
              if (uVar17 < 1000) {
                uVar25 = uVar25 - 1;
                goto LAB_0031365e;
              }
              if (uVar17 < 10000) goto LAB_0031365e;
              bVar9 = 99999 < uVar17;
              uVar31 = uVar25 + 4;
              uVar17 = uVar17 / 10000;
            } while (bVar9);
            uVar25 = uVar25 + 1;
          }
LAB_0031365e:
          local_a0 = local_90;
          std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar25);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a0,uVar25,uVar28);
          uVar26 = (ModelDescription *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            uVar26 = local_100.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar26 < (ModelDescription *)(local_98 + local_100._M_string_length)) {
            pMVar10 = (ModelDescription *)0xf;
            if (local_a0 != local_90) {
              pMVar10 = local_90[0];
            }
            if (pMVar10 < (ModelDescription *)(local_98 + local_100._M_string_length))
            goto LAB_003136fd;
            puVar16 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_a0,0,(char *)0x0,(ulong)local_100._M_dataplus._M_p);
          }
          else {
LAB_003136fd:
            puVar16 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_a0);
          }
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar16 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar16 == paVar21) {
            local_150.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
            local_150.field_2._8_8_ = puVar16[3];
          }
          else {
            local_150.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
            local_150._M_dataplus._M_p = (pointer)*puVar16;
          }
          local_150._M_string_length = puVar16[1];
          *puVar16 = paVar21;
          puVar16[1] = 0;
          paVar21->_M_local_buf[0] = '\0';
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          puVar19 = puVar16 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar16 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar19) {
            local_178.field_2._M_allocated_capacity = *puVar19;
            local_178.field_2._8_8_ = puVar16[3];
          }
          else {
            local_178.field_2._M_allocated_capacity = *puVar19;
            local_178._M_dataplus._M_p = (pointer)*puVar16;
          }
          local_178._M_string_length = puVar16[1];
          *puVar16 = puVar19;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          Result::Result(local_158,INVALID_MODEL_PARAMETERS,&local_178);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,
                            (ulong)(local_178.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,
                            (ulong)(local_150.field_2._M_allocated_capacity + 1));
          }
          if (local_a0 != local_90) {
            operator_delete(local_a0,(ulong)((long)&(local_90[0]->super_MessageLite).
                                                    _vptr_MessageLite + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,
                            (ulong)(local_100.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,
                            (ulong)(local_e0.field_2._M_allocated_capacity + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if (iVar15._M_node != (_Base_ptr)TVar1.pipelineclassifier_) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_130);
          goto LAB_00313abd;
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != (uint)local_b8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_130);
    }
    Result::Result(local_158);
  }
  else {
    if (1 < (int)uVar28) {
      uVar25 = 0;
      do {
        pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                            (this,uVar25);
        Specification::Model::Model((Model *)local_130,pTVar13);
        if ((bool)local_130[0x1c] == true) {
          uVar28 = 1;
          if (uVar25 < 10) goto LAB_00313f99;
          uVar18 = (ulong)uVar25;
          uVar31 = 4;
          goto LAB_00313af8;
        }
        Specification::Model::~Model((Model *)local_130);
        uVar25 = uVar25 + 1;
      } while (uVar28 - 1 != uVar25);
    }
    pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                        (this,uVar28 - 1);
    if (pTVar13->isupdatable_ != false) goto LAB_003134eb;
    local_130._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_130 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,
               "Last model in an updatable pipeline model should be marked as updatable.","");
    Result::Result(local_158,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_130);
    uVar26 = local_130._16_8_;
    _Var27._M_p = (pointer)local_130._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_130 + 0x10)) goto LAB_00313abd;
LAB_00313ab5:
    operator_delete(_Var27._M_p,
                    (ulong)((long)&(((ModelDescription *)uVar26)->super_MessageLite).
                                   _vptr_MessageLite + 1));
  }
  goto LAB_00313abd;
  while( true ) {
    if (uVar17 < 10000) goto LAB_00313e95;
    uVar18 = uVar18 / 10000;
    uVar31 = uVar28 + 4;
    if (uVar17 < 100000) break;
LAB_003139ec:
    uVar28 = uVar31;
    uVar17 = (uint)uVar18;
    if (uVar17 < 100) {
      uVar28 = uVar28 - 2;
      goto LAB_00313e95;
    }
    if (uVar17 < 1000) {
      uVar28 = uVar28 - 1;
      goto LAB_00313e95;
    }
  }
  uVar28 = uVar28 + 1;
LAB_00313e95:
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_150,(char)uVar28);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_150._M_dataplus._M_p,uVar28,uVar25);
  puVar16 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,0x3bb5fb);
  pRVar7 = local_158;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  puVar19 = puVar16 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar19) {
    local_178.field_2._M_allocated_capacity = *puVar19;
    local_178.field_2._8_8_ = puVar16[3];
  }
  else {
    local_178.field_2._M_allocated_capacity = *puVar19;
    local_178._M_dataplus._M_p = (pointer)*puVar16;
  }
  local_178._M_string_length = puVar16[1];
  *puVar16 = puVar19;
  puVar16[1] = 0;
  *(undefined1 *)(puVar16 + 2) = 0;
  puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar16 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar16 == paVar21) {
    local_198.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
    local_198.field_2._8_8_ = puVar16[3];
  }
  else {
    local_198.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
    local_198._M_dataplus._M_p = (pointer)*puVar16;
  }
  local_198._M_string_length = puVar16[1];
  *puVar16 = paVar21;
  puVar16[1] = 0;
  *(undefined1 *)(puVar16 + 2) = 0;
  Result::Result(pRVar7,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_198);
  goto LAB_0031408f;
  while( true ) {
    if (uVar17 < 10000) goto LAB_00313f99;
    uVar18 = uVar18 / 10000;
    uVar31 = uVar28 + 4;
    if (uVar17 < 100000) break;
LAB_00313af8:
    uVar28 = uVar31;
    uVar17 = (uint)uVar18;
    if (uVar17 < 100) {
      uVar28 = uVar28 - 2;
      goto LAB_00313f99;
    }
    if (uVar17 < 1000) {
      uVar28 = uVar28 - 1;
      goto LAB_00313f99;
    }
  }
  uVar28 = uVar28 + 1;
LAB_00313f99:
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_150,(char)uVar28);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_150._M_dataplus._M_p,uVar28,uVar25);
  puVar16 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,0x3bb54e);
  pRVar7 = local_158;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  puVar19 = puVar16 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar19) {
    local_178.field_2._M_allocated_capacity = *puVar19;
    local_178.field_2._8_8_ = puVar16[3];
  }
  else {
    local_178.field_2._M_allocated_capacity = *puVar19;
    local_178._M_dataplus._M_p = (pointer)*puVar16;
  }
  local_178._M_string_length = puVar16[1];
  *puVar16 = puVar19;
  puVar16[1] = 0;
  *(undefined1 *)(puVar16 + 2) = 0;
  puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar16 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar16 == paVar21) {
    local_198.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
    local_198.field_2._8_8_ = puVar16[3];
  }
  else {
    local_198.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
    local_198._M_dataplus._M_p = (pointer)*puVar16;
  }
  local_198._M_string_length = puVar16[1];
  *puVar16 = paVar21;
  puVar16[1] = 0;
  *(undefined1 *)(puVar16 + 2) = 0;
  Result::Result(pRVar7,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_198);
LAB_0031408f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,(ulong)(local_178.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,(ulong)(local_150.field_2._M_allocated_capacity + 1))
    ;
  }
  Specification::Model::~Model((Model *)local_130);
LAB_00313abd:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_68);
  return extraout_RAX_01;
}

Assistant:

static Result validate(const Specification::Model& spec, const Specification::Pipeline& pipelineParams) {
        const int nModels = pipelineParams.models_size();
        if (nModels == 0) {
            // empty chain is not allowed
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Pipeline must contain one or more models.");
        }

        // build a type table from the list of models
        std::unordered_map<std::string, const CoreML::Specification::FeatureDescription*> typeTable;

        // First, populate the type table with the given inputs from the pipeline
        for(const auto& input : spec.description().input() ) {
            typeTable[input.name()] = &input;
        }

        // iterate over models and check the types at each one, making sure they match up with previous versions.
        for (const auto& model : pipelineParams.models()) {
            const auto& inputs = model.description().input();

            // validate current transform against previously known valid state
            for (const CoreML::Specification::FeatureDescription& arg : inputs) {

                auto it = typeTable.find(arg.name());

                if(it == typeTable.end()) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  ("Pipeline: the input '" + arg.name() + "' of model '" + model.description().GetTypeName()
                                   + "' does not present in pipeline input or previous model."));
                }

                if(!CoreML::Specification::isEquivalent(arg, *(it->second))) {
                    return Result(ResultType::TYPE_MISMATCH,
                                  ("Pipeline: the input '" + arg.name() + "' of model '" + model.description().GetTypeName()
                                   + "' does not match the type previously specified by the pipeline input or the output of a previous model."
                                   + " For the second case, make sure the input and previous model's output has the matching name and shapes."));
                }
            }

            // validate the model itself and bail out if it's invalid
            Result r = Model::validate(model);
            if (!r.good()) { return r; }

            // Now add in the outputs of this model to the mix.
            const auto& outputs = model.description().output();
            for (const CoreML::Specification::FeatureDescription& arg : outputs) {
                typeTable[arg.name()] = &arg;
            }
        }

        // Finally, validate that the outputs of the pipeline model match what is outputted by the models.
        for(const auto& output : spec.description().output() ) {
            auto it = typeTable.find(output.name());

            if(it == typeTable.end()) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              ("Pipeline output '" + output.name() + "' not present in pipeline input or a contained model."));
            }

            if(!CoreML::Specification::isEquivalent(output, *(it->second))) {
                return Result(ResultType::TYPE_MISMATCH,
                              ("Type of pipeline output '" + output.name() + "' does not match type produced in pipeline input."));
            }
        }
        
        if (spec.isupdatable()) {
            for (int modelIdx = 0; modelIdx < nModels - 1; modelIdx++) {
                auto model = pipelineParams.models(modelIdx);
                if (model.isupdatable()) {
                    return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION,
                                  ("Only the last model in the pipeline can be updatable. Model at position '" + std::to_string(modelIdx) + "' is marked as updatable."));
                }
            }
            if (false == pipelineParams.models(nModels - 1).isupdatable()) {
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION,
                              ("Last model in an updatable pipeline model should be marked as updatable."));
            }
        } else {
            for (int modelIdx = 0; modelIdx < nModels; modelIdx++) {
                auto model = pipelineParams.models(modelIdx);
                if (model.isupdatable()) {
                    return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION,
                                  ("Found an updatable model at '" + std::to_string(modelIdx) + "' inside a non-updatable pipeline."));
                }
            }
        }

        const int nNames = pipelineParams.names_size();
        if (nNames > 0) {
            if (nNames != nModels) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              ("The number of pipeline model names '" + std::to_string(nNames) +
                               "' doesn't match the number of models '" + std::to_string(nModels) + "'"));
            }
            std::set<std::string> names;
            for (int modelIdx = 0; modelIdx < nNames; modelIdx++) {
                auto modelName = pipelineParams.names(modelIdx);
                if (names.find(modelName) != names.end()) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  ("Pipeline model name '" + modelName +
                                   "' at index '" +std::to_string(modelIdx) + " has already been used for previous models"));
                }
                names.insert(modelName);
            }

        }
        // if we get here, no input of any model caused a type mismatch with
        // any other prior model in the chain, or had an independent validation
        // error on its own.
        return Result();
    }